

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re2_test.cc
# Opt level: O2

void re2::RE2UTF8(void)

{
  bool bVar1;
  __type _Var2;
  size_t sVar3;
  char utf8_pattern [6];
  char utf8_string [10];
  string s;
  LogMessageFatal local_8a8;
  RE2 re_test4;
  RE2 re_test8;
  RE2 re_test6;
  RE2 re_test5;
  RE2 re_test2;
  RE2 re_test7;
  RE2 re_test3;
  RE2 re_test1;
  
  builtin_strncpy(utf8_string,"日本語",10);
  builtin_strncpy(utf8_pattern,".本.",6);
  re_test2.pattern_._M_dataplus._M_p = ".........";
  re_test2.pattern_._M_string_length._0_4_ = 9;
  RE2::Options::Options((Options *)&local_8a8,Latin1);
  RE2::RE2(&re_test1,(StringPiece *)&re_test2,(Options *)&local_8a8);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test1);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43c);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(utf8_string, re_test1)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  RE2::RE2(&re_test2,"...");
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test2);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x43e);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(utf8_string, re_test2)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  s._M_dataplus._M_p = (pointer)&s.field_2;
  s._M_string_length = 0;
  s.field_2._M_local_buf[0] = '\0';
  re_test4.pattern_._M_dataplus._M_p = "(.)";
  re_test4.pattern_._M_string_length._0_4_ = 3;
  RE2::Options::Options((Options *)&local_8a8,Latin1);
  RE2::RE2(&re_test3,(StringPiece *)&re_test4,(Options *)&local_8a8);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  re_test4.pattern_._M_dataplus._M_p = (pointer)&s;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*>
                    ((StringPiece *)&local_8a8,&re_test3,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&re_test4
                    );
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x444);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(utf8_string, re_test3, &s)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  std::__cxx11::string::string((string *)&local_8a8,anon_var_dwarf_15548,(allocator *)&re_test4);
  _Var2 = std::operator==(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  if (!_Var2) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x445);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: (s) == (string(\"\\xe6\"))");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  RE2::RE2(&re_test4,"(.)");
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  re_test5.pattern_._M_dataplus._M_p = (pointer)&s;
  bVar1 = RE2::PartialMatch<std::__cxx11::string*>
                    ((StringPiece *)&local_8a8,&re_test4,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)&re_test5
                    );
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x447);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::PartialMatch(utf8_string, re_test4, &s)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  std::__cxx11::string::string((string *)&local_8a8,anon_var_dwarf_1556c,(allocator *)&re_test5);
  _Var2 = std::operator==(&s,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &local_8a8);
  std::__cxx11::string::~string((string *)&local_8a8);
  if (!_Var2) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x448);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: (s) == (string(\"\\xe6\\x97\\xa5\"))");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  re_test6.pattern_._M_dataplus._M_p = utf8_string;
  sVar3 = strlen(utf8_string);
  re_test6.pattern_._M_string_length._0_4_ = (undefined4)sVar3;
  RE2::Options::Options((Options *)&local_8a8,Latin1);
  RE2::RE2(&re_test5,(StringPiece *)&re_test6,(Options *)&local_8a8);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test5);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44c);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(utf8_string, re_test5)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  RE2::RE2(&re_test6,utf8_string);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test6);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x44e);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(utf8_string, re_test6)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  re_test8.pattern_._M_dataplus._M_p = utf8_pattern;
  sVar3 = strlen(re_test8.pattern_._M_dataplus._M_p);
  re_test8.pattern_._M_string_length._0_4_ = (undefined4)sVar3;
  RE2::Options::Options((Options *)&local_8a8,Latin1);
  RE2::RE2(&re_test7,(StringPiece *)&re_test8,(Options *)&local_8a8);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test7);
  if (bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x452);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: !RE2::FullMatch(utf8_string, re_test7)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  RE2::RE2(&re_test8,utf8_pattern);
  local_8a8.super_LogMessage._0_8_ = utf8_string;
  sVar3 = strlen(utf8_string);
  local_8a8.super_LogMessage._8_4_ = SUB84(sVar3,0);
  bVar1 = RE2::FullMatch<>((StringPiece *)&local_8a8,&re_test8);
  if (!bVar1) {
    LogMessageFatal::LogMessageFatal
              (&local_8a8,
               "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/re2_test.cc"
               ,0x454);
    std::operator<<((ostream *)&local_8a8.super_LogMessage.str_,
                    "Check failed: RE2::FullMatch(utf8_string, re_test8)");
    LogMessageFatal::~LogMessageFatal(&local_8a8);
  }
  RE2::~RE2(&re_test8);
  RE2::~RE2(&re_test7);
  RE2::~RE2(&re_test6);
  RE2::~RE2(&re_test5);
  RE2::~RE2(&re_test4);
  RE2::~RE2(&re_test3);
  std::__cxx11::string::~string((string *)&s);
  RE2::~RE2(&re_test2);
  RE2::~RE2(&re_test1);
  return;
}

Assistant:

TEST(RE2, UTF8) {
  // Check UTF-8 handling
  // Three Japanese characters (nihongo)
  const char utf8_string[] = {
       (char)0xe6, (char)0x97, (char)0xa5, // 65e5
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       (char)0xe8, (char)0xaa, (char)0x9e, // 8a9e
       0
  };
  const char utf8_pattern[] = {
       '.',
       (char)0xe6, (char)0x9c, (char)0xac, // 627c
       '.',
       0
  };

  // Both should match in either mode, bytes or UTF-8
  RE2 re_test1(".........", RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test1));
  RE2 re_test2("...");
  CHECK(RE2::FullMatch(utf8_string, re_test2));

  // Check that '.' matches one byte or UTF-8 character
  // according to the mode.
  string s;
  RE2 re_test3("(.)", RE2::Latin1);
  CHECK(RE2::PartialMatch(utf8_string, re_test3, &s));
  CHECK_EQ(s, string("\xe6"));
  RE2 re_test4("(.)");
  CHECK(RE2::PartialMatch(utf8_string, re_test4, &s));
  CHECK_EQ(s, string("\xe6\x97\xa5"));

  // Check that string matches itself in either mode
  RE2 re_test5(utf8_string, RE2::Latin1);
  CHECK(RE2::FullMatch(utf8_string, re_test5));
  RE2 re_test6(utf8_string);
  CHECK(RE2::FullMatch(utf8_string, re_test6));

  // Check that pattern matches string only in UTF8 mode
  RE2 re_test7(utf8_pattern, RE2::Latin1);
  CHECK(!RE2::FullMatch(utf8_string, re_test7));
  RE2 re_test8(utf8_pattern);
  CHECK(RE2::FullMatch(utf8_string, re_test8));
}